

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O1

void __thiscall
QtPrivate::QMovableArrayOps<QDBusUnixFileDescriptor>::erase
          (QMovableArrayOps<QDBusUnixFileDescriptor> *this,QDBusUnixFileDescriptor *b,qsizetype n)

{
  qsizetype *pqVar1;
  QDBusUnixFileDescriptor *pQVar2;
  QDBusUnixFileDescriptor *pQVar3;
  long lVar4;
  
  if (n != 0) {
    lVar4 = n * 8;
    pQVar3 = b;
    do {
      QDBusUnixFileDescriptor::~QDBusUnixFileDescriptor(pQVar3);
      pQVar3 = pQVar3 + 8;
      lVar4 = lVar4 + -8;
    } while (lVar4 != 0);
  }
  pQVar3 = b + n * 8;
  pQVar2 = (this->super_QGenericArrayOps<QDBusUnixFileDescriptor>).
           super_QArrayDataPointer<QDBusUnixFileDescriptor>.ptr;
  if ((pQVar2 == b) &&
     (pQVar3 != pQVar2 + (this->super_QGenericArrayOps<QDBusUnixFileDescriptor>).
                         super_QArrayDataPointer<QDBusUnixFileDescriptor>.size * 8)) {
    (this->super_QGenericArrayOps<QDBusUnixFileDescriptor>).
    super_QArrayDataPointer<QDBusUnixFileDescriptor>.ptr = pQVar3;
  }
  else if (pQVar3 != pQVar2 + (this->super_QGenericArrayOps<QDBusUnixFileDescriptor>).
                              super_QArrayDataPointer<QDBusUnixFileDescriptor>.size * 8) {
    memmove(b,pQVar3,(long)(pQVar2 + (this->super_QGenericArrayOps<QDBusUnixFileDescriptor>).
                                     super_QArrayDataPointer<QDBusUnixFileDescriptor>.size * 8) -
                     (long)pQVar3);
  }
  pqVar1 = &(this->super_QGenericArrayOps<QDBusUnixFileDescriptor>).
            super_QArrayDataPointer<QDBusUnixFileDescriptor>.size;
  *pqVar1 = *pqVar1 - n;
  return;
}

Assistant:

void erase(T *b, qsizetype n)
    {
        T *e = b + n;

        Q_ASSERT(this->isMutable());
        Q_ASSERT(b < e);
        Q_ASSERT(b >= this->begin() && b < this->end());
        Q_ASSERT(e > this->begin() && e <= this->end());

        // Comply with std::vector::erase(): erased elements and all after them
        // are invalidated. However, erasing from the beginning effectively
        // means that all iterators are invalidated. We can use this freedom to
        // erase by moving towards the end.

        std::destroy(b, e);
        if (b == this->begin() && e != this->end()) {
            this->ptr = e;
        } else if (e != this->end()) {
            memmove(static_cast<void *>(b), static_cast<const void *>(e), (static_cast<const T *>(this->end()) - e)*sizeof(T));
        }
        this->size -= n;
    }